

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::
Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Stack<rapidjson::CrtAllocator> *this,size_t count)

{
  CrtAllocator *pCVar1;
  size_t sVar2;
  ulong uVar3;
  size_t newSize;
  size_t newCapacity;
  size_t count_local;
  Stack<rapidjson::CrtAllocator> *this_local;
  
  if (this->stack_ == (char *)0x0) {
    if (this->allocator_ == (CrtAllocator *)0x0) {
      pCVar1 = (CrtAllocator *)operator_new(1);
      this->allocator_ = pCVar1;
      this->ownAllocator_ = pCVar1;
    }
    newSize = this->initialCapacity_;
  }
  else {
    sVar2 = GetCapacity(this);
    newSize = (sVar2 + 1 >> 1) + sVar2;
  }
  sVar2 = GetSize(this);
  uVar3 = sVar2 + count * 0x10;
  if (newSize < uVar3) {
    newSize = uVar3;
  }
  Resize(this,newSize);
  return;
}

Assistant:

void Expand(size_t count) {
        // Only expand the capacity if the current stack exists. Otherwise just create a stack with initial capacity.
        size_t newCapacity;
        if (stack_ == 0) {
            if (!allocator_)
                ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();
            newCapacity = initialCapacity_;
        } else {
            newCapacity = GetCapacity();
            newCapacity += (newCapacity + 1) / 2;
        }
        size_t newSize = GetSize() + sizeof(T) * count;
        if (newCapacity < newSize)
            newCapacity = newSize;

        Resize(newCapacity);
    }